

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test::
~SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test
          (SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *this)

{
  SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *this_local;
  
  ~SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonDownEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    MouseLeftButtonDown mouseLeftButtonDown {x, y};
    EXPECT_EQ(std::get<MouseLeftButtonDown>(eventsSource.getEvent()), mouseLeftButtonDown);
}